

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void disas_subx_mem(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  int opsize;
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 pTVar1;
  TCGContext_conflict2 *pTVar2;
  TCGTemp *pTVar3;
  TCGv_i32 val;
  TCGv_i32 *ppTVar4;
  uintptr_t o_1;
  uint uVar5;
  uintptr_t o;
  TCGv_i32 val_00;
  TCGv_i32 *ppTVar6;
  long lVar7;
  
  tcg_ctx = s->uc->tcg_ctx;
  ppTVar4 = s->writeback;
  ppTVar6 = tcg_ctx->cpu_aregs;
  if (((uint)s->writeback_mask >> (insn & 7) & 1) != 0) {
    ppTVar6 = ppTVar4;
  }
  opsize = *(int *)(&DAT_00d886a4 + (insn >> 4 & 0xc));
  lVar7 = (long)opsize;
  pTVar1 = ppTVar6[insn & 7];
  tcg_gen_subi_i32_m68k(tcg_ctx,pTVar1,pTVar1,*(int32_t *)(&DAT_00d88508 + lVar7 * 4));
  uVar5 = ((s->base).tb)->flags;
  pTVar2 = s->uc->tcg_ctx;
  pTVar3 = tcg_temp_new_internal_m68k(pTVar2,TCG_TYPE_I32,false);
  val = (TCGv_i32)((long)pTVar3 - (long)pTVar2);
  tcg_gen_qemu_ld_i32_m68k
            (pTVar2,val,pTVar1,(ulong)((uVar5 >> 0xd & 1) == 0),
             *(MemOp_conflict *)(&DAT_00d88514 + lVar7 * 4));
  uVar5 = insn >> 9 & 7;
  if (((uint)s->writeback_mask >> uVar5 & 1) == 0) {
    ppTVar4 = s->uc->tcg_ctx->cpu_aregs;
  }
  pTVar1 = ppTVar4[uVar5];
  tcg_gen_subi_i32_m68k(tcg_ctx,pTVar1,pTVar1,*(int32_t *)(&DAT_00d88508 + lVar7 * 4));
  uVar5 = ((s->base).tb)->flags;
  pTVar2 = s->uc->tcg_ctx;
  pTVar3 = tcg_temp_new_internal_m68k(pTVar2,TCG_TYPE_I32,false);
  val_00 = (TCGv_i32)((long)pTVar3 - (long)pTVar2);
  tcg_gen_qemu_ld_i32_m68k
            (pTVar2,val_00,pTVar1,(ulong)((uVar5 >> 0xd & 1) == 0),
             *(MemOp_conflict *)(&DAT_00d88514 + lVar7 * 4));
  gen_subx(s,val,val_00,opsize);
  tcg_gen_qemu_st_i32_m68k
            (s->uc->tcg_ctx,QREG_CC_N,pTVar1,(ulong)((((s->base).tb)->flags >> 0xd & 1) == 0),
             *(MemOp_conflict *)(&DAT_00d88520 + lVar7 * 4));
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(val_00 + (long)tcg_ctx));
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(val + (long)tcg_ctx));
  return;
}

Assistant:

DISAS_INSN(subx_mem)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv src;
    TCGv addr_src;
    TCGv dest;
    TCGv addr_dest;
    int opsize;

    opsize = insn_opsize(insn);

    addr_src = AREG(insn, 0);
    tcg_gen_subi_i32(tcg_ctx, addr_src, addr_src, opsize_bytes(opsize));
    src = gen_load(s, opsize, addr_src, 1, IS_USER(s));

    addr_dest = AREG(insn, 9);
    tcg_gen_subi_i32(tcg_ctx, addr_dest, addr_dest, opsize_bytes(opsize));
    dest = gen_load(s, opsize, addr_dest, 1, IS_USER(s));

    gen_subx(s, src, dest, opsize);

    gen_store(s, opsize, addr_dest, QREG_CC_N, IS_USER(s));

    tcg_temp_free(tcg_ctx, dest);
    tcg_temp_free(tcg_ctx, src);
}